

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh_terrain.cxx
# Opt level: O3

void __thiscall level_mesh::separate_terrain(level_mesh *this,uint16_t texture)

{
  pointer *ppbVar1;
  pointer *pppbVar2;
  pointer pbVar3;
  iterator __position;
  iterator __position_00;
  uint16_t uVar4;
  uint16_t uVar5;
  pointer pbVar6;
  b_model_instance *pbVar7;
  long lVar8;
  uint16_t uVar9;
  b_model_instance *pbVar10;
  b_model_instance *pbVar11;
  bool bVar12;
  byte bVar13;
  b_model_instance *instance;
  b_model_instance temp;
  b_model local_a8;
  b_model_instance *local_98;
  b_model_instance local_90;
  
  bVar13 = 0;
  b_model_instance::b_model_instance(&local_90,this->m_free_tag,0xffff);
  pbVar6 = (this->super_xr_mesh_builder).m_faces.
           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->super_xr_mesh_builder).m_faces.
           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = local_90.sector;
  do {
    if (pbVar6 == pbVar3) {
      if (uVar4 != 0xffff) {
        pbVar7 = (b_model_instance *)operator_new(0x78);
        pbVar10 = &local_90;
        pbVar11 = pbVar7;
        for (lVar8 = 0xf; lVar8 != 0; lVar8 = lVar8 + -1) {
          uVar4 = pbVar10->model_id;
          uVar9 = pbVar10->sector;
          pbVar11->tag = pbVar10->tag;
          pbVar11->model_id = uVar4;
          pbVar11->sector = uVar9;
          pbVar10 = (b_model_instance *)((long)pbVar10 + ((ulong)bVar13 * -2 + 1) * 8);
          pbVar11 = (b_model_instance *)((long)pbVar11 + (ulong)bVar13 * -0x10 + 8);
        }
        local_a8.field_3.m_instances =
             (b_model_instance **)
             ((long)(this->m_instances).
                    super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_instances).
                    super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3);
        local_a8.m_type = MT_TERRAIN;
        local_a8.m_locked = false;
        local_a8.m_num_instances = 1;
        __position._M_current =
             (this->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_98 = pbVar7;
        if (__position._M_current ==
            (this->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<b_model,_std::allocator<b_model>_>::_M_realloc_insert<b_model>
                    (&this->m_models,__position,&local_a8);
        }
        else {
          (__position._M_current)->m_type = (int)2;
          (__position._M_current)->m_locked = (bool)(char)(2 >> 0x20);
          (__position._M_current)->field_0x5 = local_a8._5_1_;
          (__position._M_current)->m_num_instances = 1;
          ((__position._M_current)->field_3).m_instances = (b_model_instance **)local_a8.field_3;
          ppbVar1 = &(this->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppbVar1 = *ppbVar1 + 1;
        }
        __position_00._M_current =
             (this->m_instances).
             super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (this->m_instances).
            super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<b_model_instance*,std::allocator<b_model_instance*>>::
          _M_realloc_insert<b_model_instance*const&>
                    ((vector<b_model_instance*,std::allocator<b_model_instance*>> *)
                     &this->m_instances,__position_00,&local_98);
        }
        else {
          *__position_00._M_current = pbVar7;
          pppbVar2 = &(this->m_instances).
                      super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppbVar2 = *pppbVar2 + 1;
        }
        this->m_free_tag = this->m_free_tag + 1;
      }
      return;
    }
    uVar9 = uVar4;
    uVar5 = local_90.sector;
    if ((*(uint16_t *)&pbVar6->field_1 == texture) && (pbVar6->tag == 0xffffffff)) {
      pbVar6->tag = local_90.tag;
      uVar9 = pbVar6->sector;
      uVar5 = uVar9;
      if ((uVar4 != 0xffff) &&
         (bVar12 = uVar4 != uVar9, uVar9 = uVar4, uVar5 = local_90.sector, bVar12)) {
        __assert_fail("temp.sector == it->sector",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh_terrain.cxx"
                      ,0x84,"void level_mesh::separate_terrain(uint16_t)");
      }
    }
    local_90.sector = uVar5;
    pbVar6 = pbVar6 + 1;
    uVar4 = uVar9;
  } while( true );
}

Assistant:

void level_mesh::separate_terrain(uint16_t texture)
{
	b_model_instance temp(m_free_tag, UINT16_MAX);
	uint32_t face_idx = 0;
	for (b_face_vec_it it = m_faces.begin(), end = m_faces.end();
			it != end; ++it, ++face_idx) {
		if (it->surface.texture != texture || it->tag != BAD_IDX)
			continue;
		it->tag = temp.tag;
		if (temp.sector == UINT16_MAX)
			temp.sector = it->sector;
		else
			xr_assert(temp.sector == it->sector);
	}
	if (temp.sector != UINT16_MAX) {
		b_model_instance* instance = new b_model_instance(temp);
		m_models.push_back(b_model(b_model::MT_TERRAIN, m_instances.size()));
		m_instances.push_back(instance);
		++m_free_tag;
	}
}